

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShowLabel::mouseMoveEvent(QColorShowLabel *this,QMouseEvent *e)

{
  ulong uVar1;
  QMimeData *this_00;
  QDrag *this_01;
  long in_FS_OFFSET;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  QPainter p;
  undefined1 *local_70;
  undefined8 local_68;
  int local_60;
  int local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mousePressed == true) {
    auVar7 = QEventPoint::position();
    auVar5._0_8_ = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar7._0_8_;
    auVar5._8_8_ = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar7._8_8_;
    auVar7 = maxpd(auVar5,_DAT_006605e0);
    iVar4 = (this->pressPos).xp.m_i -
            (int)(double)(~-(ulong)(2147483647.0 < auVar5._0_8_) & auVar7._0_8_ |
                         -(ulong)(2147483647.0 < auVar5._0_8_) & 0x41dfffffffc00000);
    iVar6 = (this->pressPos).yp.m_i -
            (int)(double)(~-(ulong)(2147483647.0 < auVar5._8_8_) & auVar7._8_8_ |
                         -(ulong)(2147483647.0 < auVar5._8_8_) & 0x41dfffffffc00000);
    iVar2 = iVar4 >> 0x1f;
    iVar3 = iVar6 >> 0x1f;
    uVar1 = CONCAT44(iVar6,iVar4) ^ CONCAT44(iVar3,iVar2);
    iVar4 = QApplication::startDragDistance();
    if (iVar4 < ((int)(uVar1 >> 0x20) - iVar3) + ((int)uVar1 - iVar2)) {
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      QColor::operator_cast_to_QVariant((QVariant *)&local_58,&this->col);
      QMimeData::setColorData((QVariant *)this_00);
      ::QVariant::~QVariant((QVariant *)&local_58);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58.data,0x1e,0x14);
      QPixmap::fill((QColor *)&local_58);
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_70,(QPaintDevice *)local_58.data);
      iVar4 = QPixmap::width();
      local_5c = QPixmap::height();
      local_68._0_4_ = 0;
      local_68._4_4_ = 0;
      local_60 = iVar4 + -2;
      local_5c = local_5c + -2;
      QPainter::drawRects((QRect *)&local_70,(int)&local_68);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,(QObject *)this);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      this->mousePressed = false;
      QDrag::exec(this_01,1);
      QPainter::~QPainter((QPainter *)&local_70);
      QPixmap::~QPixmap((QPixmap *)local_58.data);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShowLabel::mouseMoveEvent(QMouseEvent *e)
{
#if !QT_CONFIG(draganddrop)
    Q_UNUSED(e);
#else
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(30, 20);
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}